

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void av1_rd_use_partition
               (AV1_COMP *cpi,ThreadData *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,int *rate,int64_t *dist,
               int do_recon,PC_TREE *pc_tree)

{
  undefined1 uVar1;
  RD_STATS best_rd;
  RD_STATS best_rd_00;
  RD_STATS best_rd_01;
  RD_STATS best_rd_02;
  RD_STATS best_rd_03;
  RD_STATS best_rd_04;
  RD_STATS best_rd_05;
  byte bVar2;
  BLOCK_SIZE BVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AV1_COMMON *cm_00;
  PICK_MODE_CONTEXT *pPVar8;
  PC_TREE *pPVar9;
  TileDataEnc *in_RCX;
  ThreadData *in_RDX;
  AV1_COMP *in_RSI;
  long in_RDI;
  MB_MODE_INFO **in_R8;
  uint in_R9D;
  int unaff_retaddr;
  BLOCK_SIZE BStack0000000000000008;
  BLOCK_SIZE in_stack_00000010;
  undefined7 in_stack_00000011;
  int64_t *in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  undefined4 in_stack_0000002c;
  byte *in_stack_00000030;
  RD_STATS tmp_rdc_3;
  int y_idx_1;
  int x_idx_1;
  int i_4;
  BLOCK_SIZE split_subsize;
  RD_STATS tmp_rdc_2;
  int ii;
  int jj;
  int y_idx;
  int x_idx;
  int i_3;
  PICK_MODE_CONTEXT *ctx_v;
  RD_STATS tmp_rdc_1;
  int i_2;
  PICK_MODE_CONTEXT *ctx_h;
  RD_STATS tmp_rdc;
  int i_1;
  int i;
  int orig_rdmult;
  PICK_MODE_CONTEXT *ctx_none;
  int use_partition_none;
  BLOCK_SIZE bs_type;
  RD_STATS invalid_rdc;
  RD_STATS chosen_rdc;
  RD_STATS none_rdc;
  RD_STATS last_part_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  BLOCK_SIZE subsize;
  PARTITION_TYPE partition;
  int pl;
  int hbs;
  int bs;
  ModeCosts *mode_costs;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile_info;
  int num_planes;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  PARTITION_TYPE in_stack_fffffffffffffc35;
  BLOCK_SIZE in_stack_fffffffffffffc36;
  int64_t in_stack_fffffffffffffc48;
  int64_t in_stack_fffffffffffffc50;
  MACROBLOCK *in_stack_fffffffffffffc58;
  AV1_COMP *in_stack_fffffffffffffc60;
  MACROBLOCK *in_stack_fffffffffffffc68;
  uint uVar10;
  int in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  AV1_COMP *in_stack_fffffffffffffc80;
  RD_STATS *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  uint uVar11;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 uVar12;
  int in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  long local_348;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  BLOCK_SIZE in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcc9;
  TileDataEnc *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  uint in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  int in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcec;
  undefined8 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  RUN_TYPE in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd01;
  BLOCK_SIZE in_stack_fffffffffffffd08;
  undefined7 uStack_2f7;
  PC_TREE *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd18;
  int local_2dc;
  int local_2d0;
  BLOCK_SIZE in_stack_fffffffffffffd36;
  RUN_TYPE in_stack_fffffffffffffd37;
  TokenExtra **in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  BLOCK_SIZE in_stack_fffffffffffffd47;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  AV1_COMP *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 uVar13;
  RUN_TYPE RVar14;
  int iVar15;
  undefined1 local_288 [40];
  RD_STATS local_260;
  RD_STATS local_238;
  int local_210 [2];
  PC_TREE_SHARED_BUFFERS *in_stack_fffffffffffffdf8;
  long in_stack_fffffffffffffe00;
  AV1_COMP *in_stack_fffffffffffffe08;
  undefined4 in_stack_ffffffffffffffb0;
  ThreadData *pTVar16;
  AV1_COMP *pAVar17;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  av1_num_planes(cm_00);
  uVar11 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [in_stack_00000010];
  uVar4 = uVar11 / 2;
  pTVar16 = in_RDX;
  pAVar17 = in_RSI;
  if (in_stack_00000010 < BLOCK_8X8) {
    iVar7 = 0;
    uVar10 = 0;
    iVar5 = iVar7;
  }
  else {
    iVar5 = partition_plane_context
                      ((MACROBLOCKD *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19),
                       in_R9D,_BStack0000000000000008,in_stack_00000010);
    iVar7 = iVar5;
    bVar2 = get_partition(cm_00,in_R9D,_BStack0000000000000008,in_stack_00000010);
    uVar10 = (uint)bVar2;
  }
  bVar2 = (byte)uVar10;
  get_partition_subsize(in_stack_fffffffffffffc36,in_stack_fffffffffffffc35);
  uVar1 = **(undefined1 **)&in_RCX->tile_info;
  iVar15 = 0;
  (in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost[0x11][0] = 0;
  if (*(long *)(in_stack_00000030 + 8) == 0) {
    pPVar8 = av1_alloc_pmc(in_stack_fffffffffffffe08,
                           (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe00 >> 0x38),
                           in_stack_fffffffffffffdf8);
    *(PICK_MODE_CONTEXT **)(in_stack_00000030 + 8) = pPVar8;
    if (*(long *)(in_stack_00000030 + 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)
                          (in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb8],AOM_CODEC_MEM_ERROR
                         ,"Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  if (((int)in_R9D < *(int *)(in_RDI + 0x3c194)) &&
     (_BStack0000000000000008 < *(int *)(in_RDI + 0x3c198))) {
    av1_invalid_rd_stats((RD_STATS *)local_210);
    av1_invalid_rd_stats(&local_238);
    av1_invalid_rd_stats(&local_260);
    av1_invalid_rd_stats((RD_STATS *)local_288);
    *in_stack_00000030 = bVar2;
    *(TXFM_CONTEXT **)(in_RSI->enc_quant_dequant_params).quants.y_zbin[0x15] =
         (cm_00->above_contexts).txfm[*(int *)&(in_RDX->mb).plane[0].qcoeff] +
         _BStack0000000000000008;
    *(long *)((in_RSI->enc_quant_dequant_params).quants.y_zbin[0x15] + 4) =
         (long)(in_RSI->enc_quant_dequant_params).quants.y_zbin[0x16] + (long)(int)(in_R9D & 0x1f);
    av1_save_context((MACROBLOCK *)in_stack_fffffffffffffc60,
                     (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffc58,
                     (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50,
                     (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                     (int)in_stack_fffffffffffffc48);
    if ((in_stack_00000010 == BLOCK_16X16) && (*(int *)(in_RDI + 0x81330) != 0)) {
      av1_set_offsets(in_stack_fffffffffffffc80,
                      (TileInfo *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                      (MACROBLOCK *)CONCAT44(iVar7,uVar10),
                      (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),(int)in_stack_fffffffffffffc68
                      ,(BLOCK_SIZE)((ulong)in_stack_fffffffffffffc60 >> 0x38));
      iVar6 = av1_log_block_var((AV1_COMP *)CONCAT44(iVar7,uVar10),in_stack_fffffffffffffc68,
                                (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc60 >> 0x38));
      *(int *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x21] + 4) = iVar6;
    }
    uVar13 = *(undefined4 *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4);
    setup_block_rdmult(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                       (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                       (int)in_stack_fffffffffffffc50,
                       (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                       (AQ_MODE)((ulong)in_stack_fffffffffffffc48 >> 0x30),
                       (MB_MODE_INFO *)CONCAT44(iVar7,uVar10));
    if ((((bVar2 != 0) &&
         (iVar7 = is_adjust_var_based_part_enabled
                            (cm_00,(PARTITION_SPEED_FEATURES *)(in_RDI + 0x60950),in_stack_00000010)
         , iVar7 != 0)) && ((int)(in_R9D + uVar4) < *(int *)(in_RDI + 0x3c194))) &&
       ((int)(_BStack0000000000000008 + uVar4) < *(int *)(in_RDI + 0x3c198))) {
      **(BLOCK_SIZE **)&in_RCX->tile_info = in_stack_00000010;
      *in_stack_00000030 = 0;
      (in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost[0x11][0] = 1;
      best_rd.zero_rate = in_stack_fffffffffffffcdc;
      best_rd.rate = in_stack_fffffffffffffcd8;
      best_rd.dist._0_4_ = in_stack_fffffffffffffce0;
      best_rd.dist._4_4_ = in_stack_fffffffffffffce4;
      best_rd.rdcost._0_4_ = in_stack_fffffffffffffce8;
      best_rd.rdcost._4_4_ = in_stack_fffffffffffffcec;
      best_rd.sse = in_stack_fffffffffffffcf0;
      best_rd._32_4_ = in_stack_fffffffffffffcf8;
      best_rd._36_4_ = in_stack_fffffffffffffcfc;
      in_stack_fffffffffffffc48 = local_288._8_8_;
      in_stack_fffffffffffffc50 = local_288._16_8_;
      in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
      in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
      pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (TileDataEnc *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                    (PARTITION_TYPE)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
                    (PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,best_rd);
      if (local_238.rate < 0x7fffffff) {
        local_238.rate =
             *(int *)((long)(in_RSI->enc_quant_dequant_params).quants.y_quant_fp +
                     (long)iVar5 * 0x28 + 0x220) + local_238.rate;
        local_238.rdcost =
             ((long)local_238.rate *
              (long)*(int *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
             >> 9) + local_238.dist * 0x80;
      }
      if ((local_238.rate < 0x7fffffff) && (local_238.skip_txfm == '\x01')) {
        iVar15 = 1;
      }
      av1_restore_context((MACROBLOCK *)in_stack_fffffffffffffc60,
                          (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffc58,
                          (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                          (int)in_stack_fffffffffffffc50,
                          (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                          (int)in_stack_fffffffffffffc48);
      **(undefined1 **)&in_RCX->tile_info = uVar1;
      *in_stack_00000030 = bVar2;
    }
    for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
      pPVar9 = av1_alloc_pc_tree_node(BLOCK_4X4);
      *(PC_TREE **)(in_stack_00000030 + (long)iVar7 * 8 + 0xd0) = pPVar9;
      if (*(long *)(in_stack_00000030 + (long)iVar7 * 8 + 0xd0) == 0) {
        aom_internal_error(*(aom_internal_error_info **)
                            (in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb8],
                           AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE");
      }
      *(int *)(*(long *)(in_stack_00000030 + (long)iVar7 * 8 + 0xd0) + 0xf0) = iVar7;
    }
    switch(bVar2) {
    case 0:
      best_rd_00.zero_rate = in_stack_fffffffffffffcdc;
      best_rd_00.rate = in_stack_fffffffffffffcd8;
      best_rd_00.dist._0_4_ = in_stack_fffffffffffffce0;
      best_rd_00.dist._4_4_ = in_stack_fffffffffffffce4;
      best_rd_00.rdcost._0_4_ = in_stack_fffffffffffffce8;
      best_rd_00.rdcost._4_4_ = in_stack_fffffffffffffcec;
      best_rd_00.sse = in_stack_fffffffffffffcf0;
      best_rd_00._32_4_ = in_stack_fffffffffffffcf8;
      best_rd_00._36_4_ = in_stack_fffffffffffffcfc;
      in_stack_fffffffffffffc48 = local_288._8_8_;
      in_stack_fffffffffffffc50 = local_288._16_8_;
      in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
      in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
      pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (TileDataEnc *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                    (PARTITION_TYPE)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
                    (PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,best_rd_00);
      break;
    case 1:
      if (iVar15 == 0) {
        uVar12 = 0;
        for (iVar15 = 0; RVar14 = (RUN_TYPE)uVar12, iVar15 < 2; iVar15 = iVar15 + 1) {
          pPVar8 = av1_alloc_pmc(in_stack_fffffffffffffe08,
                                 (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe00 >> 0x38),
                                 in_stack_fffffffffffffdf8);
          *(PICK_MODE_CONTEXT **)(in_stack_00000030 + (long)iVar15 * 8 + 0x10) = pPVar8;
          if (*(long *)(in_stack_00000030 + (long)iVar15 * 8 + 0x10) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                (in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb8],
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        best_rd_01.zero_rate = in_stack_fffffffffffffcdc;
        best_rd_01.rate = in_stack_fffffffffffffcd8;
        best_rd_01.dist._0_4_ = in_stack_fffffffffffffce0;
        best_rd_01.dist._4_4_ = in_stack_fffffffffffffce4;
        best_rd_01.rdcost._0_4_ = in_stack_fffffffffffffce8;
        best_rd_01.rdcost._4_4_ = in_stack_fffffffffffffcec;
        best_rd_01.sse = in_stack_fffffffffffffcf0;
        best_rd_01._32_4_ = in_stack_fffffffffffffcf8;
        best_rd_01._36_4_ = in_stack_fffffffffffffcfc;
        in_stack_fffffffffffffc48 = local_288._8_8_;
        in_stack_fffffffffffffc50 = local_288._16_8_;
        in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
        in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
        pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                      (TileDataEnc *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                      (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                      (PARTITION_TYPE)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
                      (PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,best_rd_01);
        if (((local_210[0] != 0x7fffffff) && (BLOCK_8X4 < in_stack_00000010)) &&
           ((int)(in_R9D + uVar4) < *(int *)(in_RDI + 0x3c194))) {
          av1_init_rd_stats((RD_STATS *)&local_2d0);
          av1_update_state((AV1_COMP *)CONCAT44(uVar13,iVar7),
                           (ThreadData *)CONCAT44(iVar15,in_stack_fffffffffffffd58),
                           (PICK_MODE_CONTEXT *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                           in_stack_fffffffffffffd48,in_stack_fffffffffffffd47,RVar14);
          encode_superblock(in_stack_fffffffffffffd50,
                            (TileDataEnc *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                            (ThreadData *)
                            CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38,in_stack_fffffffffffffd37,
                            in_stack_fffffffffffffd36,(int *)CONCAT44(uVar13,iVar7));
          best_rd_02.zero_rate = in_stack_fffffffffffffcdc;
          best_rd_02.rate = in_stack_fffffffffffffcd8;
          best_rd_02.dist._0_4_ = in_stack_fffffffffffffce0;
          best_rd_02.dist._4_4_ = in_stack_fffffffffffffce4;
          best_rd_02.rdcost._0_4_ = in_stack_fffffffffffffce8;
          best_rd_02.rdcost._4_4_ = in_stack_fffffffffffffcec;
          best_rd_02.sse = in_stack_fffffffffffffcf0;
          best_rd_02._32_4_ = in_stack_fffffffffffffcf8;
          best_rd_02._36_4_ = in_stack_fffffffffffffcfc;
          in_stack_fffffffffffffc48 = local_288._8_8_;
          in_stack_fffffffffffffc50 = local_288._16_8_;
          in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
          in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
          pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                        (TileDataEnc *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                        ,(MACROBLOCK *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                        ,in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc90,(PARTITION_TYPE)in_stack_fffffffffffffcc0,
                        in_stack_fffffffffffffcc8,(PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,
                        best_rd_02);
          if ((local_2d0 == 0x7fffffff) ||
             (in_stack_fffffffffffffd38 == (TokenExtra **)0x7fffffffffffffff)) {
            av1_invalid_rd_stats((RD_STATS *)local_210);
          }
          else {
            local_210[0] = local_2d0 + local_210[0];
            in_stack_fffffffffffffdf8 =
                 (PC_TREE_SHARED_BUFFERS *)
                 ((long)in_stack_fffffffffffffd38 + (long)in_stack_fffffffffffffdf8);
            in_stack_fffffffffffffe00 =
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40) +
                 in_stack_fffffffffffffe00;
          }
        }
      }
      else {
        av1_invalid_rd_stats((RD_STATS *)local_210);
      }
      break;
    case 2:
      if (iVar15 == 0) {
        uVar12 = 0;
        for (local_2dc = 0; RVar14 = (RUN_TYPE)uVar12, local_2dc < 2; local_2dc = local_2dc + 1) {
          pPVar8 = av1_alloc_pmc(in_stack_fffffffffffffe08,
                                 (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe00 >> 0x38),
                                 in_stack_fffffffffffffdf8);
          *(PICK_MODE_CONTEXT **)(in_stack_00000030 + (long)local_2dc * 8 + 0x20) = pPVar8;
          if (*(long *)(in_stack_00000030 + (long)local_2dc * 8 + 0x20) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                (in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb8],
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        best_rd_03.zero_rate = in_stack_fffffffffffffcdc;
        best_rd_03.rate = in_stack_fffffffffffffcd8;
        best_rd_03.dist._0_4_ = in_stack_fffffffffffffce0;
        best_rd_03.dist._4_4_ = in_stack_fffffffffffffce4;
        best_rd_03.rdcost._0_4_ = in_stack_fffffffffffffce8;
        best_rd_03.rdcost._4_4_ = in_stack_fffffffffffffcec;
        best_rd_03.sse = in_stack_fffffffffffffcf0;
        best_rd_03._32_4_ = in_stack_fffffffffffffcf8;
        best_rd_03._36_4_ = in_stack_fffffffffffffcfc;
        in_stack_fffffffffffffc48 = local_288._8_8_;
        in_stack_fffffffffffffc50 = local_288._16_8_;
        in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
        in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
        pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                      (TileDataEnc *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                      (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                      (PARTITION_TYPE)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
                      (PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,best_rd_03);
        if (((local_210[0] != 0x7fffffff) && (BLOCK_8X4 < in_stack_00000010)) &&
           ((int)(_BStack0000000000000008 + uVar4) < *(int *)(in_RDI + 0x3c198))) {
          in_stack_fffffffffffffcf0 = *(undefined8 *)(in_stack_00000030 + 0x20);
          av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffffcf8);
          av1_update_state((AV1_COMP *)CONCAT44(uVar13,iVar7),
                           (ThreadData *)
                           CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           (PICK_MODE_CONTEXT *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                           in_stack_fffffffffffffd48,in_stack_fffffffffffffd47,RVar14);
          encode_superblock(in_stack_fffffffffffffd50,
                            (TileDataEnc *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                            (ThreadData *)
                            CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38,in_stack_fffffffffffffd37,
                            in_stack_fffffffffffffd36,(int *)CONCAT44(uVar13,iVar7));
          best_rd_04.zero_rate = in_stack_fffffffffffffcdc;
          best_rd_04.rate = in_stack_fffffffffffffcd8;
          best_rd_04.dist._0_4_ = in_stack_fffffffffffffce0;
          best_rd_04.dist._4_4_ = in_stack_fffffffffffffce4;
          best_rd_04.rdcost._0_4_ = in_stack_fffffffffffffce8;
          best_rd_04.rdcost._4_4_ = in_stack_fffffffffffffcec;
          best_rd_04.sse = in_stack_fffffffffffffcf0;
          best_rd_04._32_4_ = in_stack_fffffffffffffcf8;
          best_rd_04._36_4_ = in_stack_fffffffffffffcfc;
          in_stack_fffffffffffffc48 = local_288._8_8_;
          in_stack_fffffffffffffc50 = local_288._16_8_;
          in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
          in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
          pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                        (TileDataEnc *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                        ,(MACROBLOCK *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                        ,in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc90,(PARTITION_TYPE)in_stack_fffffffffffffcc0,
                        in_stack_fffffffffffffcc8,(PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,
                        best_rd_04);
          if ((in_stack_fffffffffffffcf8 == 0x7fffffff) ||
             (CONCAT71(in_stack_fffffffffffffd01,in_stack_fffffffffffffd00) == 0x7fffffffffffffff))
          {
            av1_invalid_rd_stats((RD_STATS *)local_210);
          }
          else {
            local_210[0] = in_stack_fffffffffffffcf8 + local_210[0];
            in_stack_fffffffffffffdf8 =
                 (PC_TREE_SHARED_BUFFERS *)
                 ((long)in_stack_fffffffffffffdf8->coeff_buf +
                 CONCAT71(in_stack_fffffffffffffd01,in_stack_fffffffffffffd00));
            in_stack_fffffffffffffe00 =
                 CONCAT71(uStack_2f7,in_stack_fffffffffffffd08) + in_stack_fffffffffffffe00;
          }
        }
      }
      else {
        av1_invalid_rd_stats((RD_STATS *)local_210);
      }
      break;
    case 3:
      if (iVar15 == 0) {
        local_210[0] = 0;
        in_stack_fffffffffffffdf8 = (PC_TREE_SHARED_BUFFERS *)0x0;
        in_stack_fffffffffffffe00 = 0;
        for (in_stack_fffffffffffffcec = 0; (int)in_stack_fffffffffffffcec < 4;
            in_stack_fffffffffffffcec = in_stack_fffffffffffffcec + 1) {
          in_stack_fffffffffffffce8 = (in_stack_fffffffffffffcec & 1) * uVar4;
          in_stack_fffffffffffffce0 = (int)in_stack_fffffffffffffcec >> 1;
          in_stack_fffffffffffffce4 = in_stack_fffffffffffffce0 * uVar4;
          in_stack_fffffffffffffcdc = in_stack_fffffffffffffcec & 1;
          if (((int)(in_R9D + in_stack_fffffffffffffce4) < *(int *)(in_RDI + 0x3c194)) &&
             (_BStack0000000000000008 + in_stack_fffffffffffffce8 < *(int *)(in_RDI + 0x3c198))) {
            av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffffcb0);
            in_stack_fffffffffffffc50 =
                 *(int64_t *)(in_stack_00000030 + (long)(int)in_stack_fffffffffffffcec * 8 + 0xd0);
            in_stack_fffffffffffffc48 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                          (uint)(in_stack_fffffffffffffcec != 3));
            av1_rd_use_partition
                      (pAVar17,pTVar16,in_RCX,in_R8,
                       (TokenExtra **)CONCAT44(in_R9D,in_stack_ffffffffffffffb0),
                       (int)((ulong)cm_00 >> 0x20),unaff_retaddr,BStack0000000000000008,
                       (int *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000018,
                       in_stack_00000020,(PC_TREE *)CONCAT44(in_stack_0000002c,in_stack_00000028));
            if ((in_stack_fffffffffffffcb0 == 0x7fffffff) || (local_348 == 0x7fffffffffffffff)) {
              av1_invalid_rd_stats((RD_STATS *)local_210);
              break;
            }
            local_210[0] = in_stack_fffffffffffffcb0 + local_210[0];
            in_stack_fffffffffffffdf8 =
                 (PC_TREE_SHARED_BUFFERS *)((long)in_stack_fffffffffffffdf8->coeff_buf + local_348);
          }
        }
      }
      else {
        av1_invalid_rd_stats((RD_STATS *)local_210);
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    }
    if (local_210[0] < 0x7fffffff) {
      local_210[0] = *(int *)((long)(in_RSI->enc_quant_dequant_params).quants.y_quant_fp +
                             (ulong)bVar2 * 4 + (long)iVar5 * 0x28 + 0x220) + local_210[0];
      in_stack_fffffffffffffe00 =
           ((long)local_210[0] *
            (long)*(int *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
           >> 9) + (long)in_stack_fffffffffffffdf8 * 0x80;
    }
    if (((((*(char *)(in_RDI + 0x60950) == '\x02') && (2 < *(int *)(in_RDI + 0x6096c))) &&
         (bVar2 != 3)) &&
        ((BLOCK_8X8 < in_stack_00000010 &&
         (((int)(in_R9D + uVar11) < *(int *)(in_RDI + 0x3c194) ||
          (in_R9D + uVar4 == *(int *)(in_RDI + 0x3c194))))))) &&
       (((int)(_BStack0000000000000008 + uVar11) < *(int *)(in_RDI + 0x3c198) ||
        (_BStack0000000000000008 + uVar4 == *(int *)(in_RDI + 0x3c198))))) {
      BVar3 = get_partition_subsize(in_stack_fffffffffffffc36,in_stack_fffffffffffffc35);
      uVar12 = CONCAT13(BVar3,(int3)in_stack_fffffffffffffcac);
      local_260.rate = 0;
      local_260.dist = 0;
      av1_restore_context((MACROBLOCK *)in_stack_fffffffffffffc60,
                          (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffc58,
                          (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                          (int)in_stack_fffffffffffffc50,
                          (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                          (int)in_stack_fffffffffffffc48);
      *in_stack_00000030 = 3;
      for (uVar11 = 0; (int)uVar11 < 4; uVar11 = uVar11 + 1) {
        iVar7 = (uVar11 & 1) * uVar4;
        iVar15 = ((int)uVar11 >> 1) * uVar4;
        if (((int)(in_R9D + iVar15) < *(int *)(in_RDI + 0x3c194)) &&
           (_BStack0000000000000008 + iVar7 < *(int *)(in_RDI + 0x3c198))) {
          av1_save_context((MACROBLOCK *)in_stack_fffffffffffffc60,
                           (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffc58,
                           (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                           (int)in_stack_fffffffffffffc50,
                           (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                           (int)in_stack_fffffffffffffc48);
          **(undefined1 **)(in_stack_00000030 + (long)(int)uVar11 * 8 + 0xd0) = 0;
          if (*(long *)(*(long *)(in_stack_00000030 + (long)(int)uVar11 * 8 + 0xd0) + 8) == 0) {
            pPVar8 = av1_alloc_pmc(in_stack_fffffffffffffe08,
                                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe00 >> 0x38),
                                   in_stack_fffffffffffffdf8);
            *(PICK_MODE_CONTEXT **)(*(long *)(in_stack_00000030 + (long)(int)uVar11 * 8 + 0xd0) + 8)
                 = pPVar8;
          }
          if (*(long *)(*(long *)(in_stack_00000030 + (long)(int)uVar11 * 8 + 0xd0) + 8) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                (in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb8],
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
          best_rd_05.zero_rate = in_stack_fffffffffffffcdc;
          best_rd_05.rate = in_stack_fffffffffffffcd8;
          best_rd_05.dist._0_4_ = in_stack_fffffffffffffce0;
          best_rd_05.dist._4_4_ = in_stack_fffffffffffffce4;
          best_rd_05.rdcost._0_4_ = in_stack_fffffffffffffce8;
          best_rd_05.rdcost._4_4_ = in_stack_fffffffffffffcec;
          best_rd_05.sse = in_stack_fffffffffffffcf0;
          best_rd_05._32_4_ = in_stack_fffffffffffffcf8;
          best_rd_05._36_4_ = in_stack_fffffffffffffcfc;
          in_stack_fffffffffffffc48 = local_288._8_8_;
          in_stack_fffffffffffffc50 = local_288._16_8_;
          in_stack_fffffffffffffc58 = (MACROBLOCK *)local_288._24_8_;
          in_stack_fffffffffffffc60 = (AV1_COMP *)local_288._32_8_;
          pick_sb_modes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                        (TileDataEnc *)CONCAT44(uVar12,uVar11),(MACROBLOCK *)CONCAT44(iVar7,iVar15),
                        in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc90,(PARTITION_TYPE)in_stack_fffffffffffffcc0,
                        in_stack_fffffffffffffcc8,(PICK_MODE_CONTEXT *)in_stack_fffffffffffffcd0,
                        best_rd_05);
          av1_restore_context((MACROBLOCK *)in_stack_fffffffffffffc60,
                              (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffc58,
                              (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                              (int)in_stack_fffffffffffffc50,
                              (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                              (int)in_stack_fffffffffffffc48);
          if ((in_stack_fffffffffffffc78 == 0x7fffffff) ||
             (in_stack_fffffffffffffc80 == (AV1_COMP *)0x7fffffffffffffff)) {
            av1_invalid_rd_stats(&local_260);
            break;
          }
          local_260.rate = in_stack_fffffffffffffc78 + local_260.rate;
          local_260.dist =
               (long)((in_stack_fffffffffffffc80->enc_quant_dequant_params).quants.y_quant + -1) +
               local_260.dist;
          if (uVar11 != 3) {
            encode_sb((AV1_COMP *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      (ThreadData *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                      in_stack_fffffffffffffcd0,
                      (TokenExtra **)CONCAT71(in_stack_fffffffffffffcc9,in_stack_fffffffffffffcc8),
                      in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,in_stack_fffffffffffffd00,
                      in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18)
            ;
          }
          local_260.rate =
               *(int *)((long)(in_RSI->enc_quant_dequant_params).quants.y_quant_fp +
                       (long)iVar5 * 0x28 + 0x220) + local_260.rate;
        }
      }
      if (local_260.rate < 0x7fffffff) {
        local_260.rate =
             *(int *)((long)(in_RSI->enc_quant_dequant_params).quants.y_quant_fp +
                     (long)iVar5 * 0x28 + 0x22c) + local_260.rate;
        local_260.rdcost =
             ((long)local_260.rate *
              (long)*(int *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
             >> 9) + local_260.dist * 0x80;
      }
    }
    if (in_stack_fffffffffffffe00 < local_260.rdcost) {
      **(undefined1 **)&in_RCX->tile_info = uVar1;
      if (BLOCK_8X4 < in_stack_00000010) {
        *in_stack_00000030 = bVar2;
      }
      memcpy(&local_260,local_210,0x28);
    }
    if ((local_238.rdcost < 0x7fffffffffffffff) &&
       (local_238.rdcost - (local_238.rdcost >> 9) < local_260.rdcost)) {
      **(BLOCK_SIZE **)&in_RCX->tile_info = in_stack_00000010;
      if (BLOCK_8X4 < in_stack_00000010) {
        *in_stack_00000030 = 0;
      }
      memcpy(&local_260,&local_238,0x28);
    }
    av1_restore_context((MACROBLOCK *)in_stack_fffffffffffffc60,
                        (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffc58,
                        (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                        (int)in_stack_fffffffffffffc50,
                        (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc48 >> 0x38),
                        (int)in_stack_fffffffffffffc48);
    if (in_stack_00000028 != 0) {
      if (in_stack_00000010 == cm_00->seq_params->sb_size) {
        set_cb_offsets((uint16_t *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x18] + 4),
                       0,0);
        encode_sb((AV1_COMP *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                  (ThreadData *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                  in_stack_fffffffffffffcd0,
                  (TokenExtra **)CONCAT71(in_stack_fffffffffffffcc9,in_stack_fffffffffffffcc8),
                  in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,in_stack_fffffffffffffd00,
                  in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18);
      }
      else {
        encode_sb((AV1_COMP *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                  (ThreadData *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                  in_stack_fffffffffffffcd0,
                  (TokenExtra **)CONCAT71(in_stack_fffffffffffffcc9,in_stack_fffffffffffffcc8),
                  in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,in_stack_fffffffffffffd00,
                  in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18);
      }
    }
    *(int *)in_stack_00000018 = local_260.rate;
    *(int64_t *)CONCAT44(in_stack_00000024,in_stack_00000020) = local_260.dist;
    *(undefined4 *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) = uVar13;
  }
  return;
}

Assistant:

void av1_rd_use_partition(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                          MB_MODE_INFO **mib, TokenExtra **tp, int mi_row,
                          int mi_col, BLOCK_SIZE bsize, int *rate,
                          int64_t *dist, int do_recon, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS last_part_rdc, none_rdc, chosen_rdc, invalid_rdc;
  BLOCK_SIZE bs_type = mib[0]->bsize;
  int use_partition_none = 0;
  x->try_merge_partition = 0;

  if (pc_tree->none == NULL) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  }
  PICK_MODE_CONTEXT *ctx_none = pc_tree->none;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  // In rt mode, currently the min partition size is BLOCK_8X8.
  assert(bsize >= cpi->sf.part_sf.default_min_partition_size);

  av1_invalid_rd_stats(&last_part_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_invalid_rd_stats(&chosen_rdc);
  av1_invalid_rd_stats(&invalid_rdc);

  pc_tree->partitioning = partition;

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh) {
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);
    x->mb_energy = av1_log_block_var(cpi, x, bsize);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  if (partition != PARTITION_NONE &&
      is_adjust_var_based_part_enabled(cm, &cpi->sf.part_sf, bsize) &&
      (mi_row + hbs < mi_params->mi_rows &&
       mi_col + hbs < mi_params->mi_cols)) {
    assert(bsize > cpi->sf.part_sf.default_min_partition_size);
    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    x->try_merge_partition = 1;
    pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &none_rdc, PARTITION_NONE,
                  bsize, ctx_none, invalid_rdc);

    if (none_rdc.rate < INT_MAX) {
      none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
      none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
    }

    // Try to skip split partition evaluation based on none partition
    // characteristics.
    if (none_rdc.rate < INT_MAX && none_rdc.skip_txfm == 1) {
      use_partition_none = 1;
    }

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    mib[0]->bsize = bs_type;
    pc_tree->partitioning = partition;
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
    if (!pc_tree->split[i])
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    pc_tree->split[i]->index = i;
  }
  switch (partition) {
    case PARTITION_NONE:
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_NONE, bsize, ctx_none, invalid_rdc);
      break;
    case PARTITION_HORZ:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->horizontal[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->horizontal[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_HORZ, subsize, pc_tree->horizontal[0],
                    invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_row + hbs < mi_params->mi_rows) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_h = pc_tree->horizontal[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_h, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row + hbs, mi_col, &tmp_rdc,
                      PARTITION_HORZ, subsize, pc_tree->horizontal[1],
                      invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_VERT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->vertical[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->vertical[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_VERT, subsize, pc_tree->vertical[0], invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_col + hbs < mi_params->mi_cols) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_v = pc_tree->vertical[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_v, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row, mi_col + hbs, &tmp_rdc,
                      PARTITION_VERT, subsize,
                      pc_tree->vertical[bsize > BLOCK_8X8], invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_SPLIT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      last_part_rdc.rate = 0;
      last_part_rdc.dist = 0;
      last_part_rdc.rdcost = 0;
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        int jj = i >> 1, ii = i & 0x01;
        RD_STATS tmp_rdc;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;

        av1_init_rd_stats(&tmp_rdc);
        av1_rd_use_partition(
            cpi, td, tile_data,
            mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
            mi_row + y_idx, mi_col + x_idx, subsize, &tmp_rdc.rate,
            &tmp_rdc.dist, i != (SUB_PARTITIONS_SPLIT - 1), pc_tree->split[i]);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }

  if (last_part_rdc.rate < INT_MAX) {
    last_part_rdc.rate += mode_costs->partition_cost[pl][partition];
    last_part_rdc.rdcost =
        RDCOST(x->rdmult, last_part_rdc.rate, last_part_rdc.dist);
  }

  if ((cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION &&
       cpi->sf.part_sf.adjust_var_based_rd_partitioning > 2) &&
      partition != PARTITION_SPLIT && bsize > BLOCK_8X8 &&
      (mi_row + bs < mi_params->mi_rows ||
       mi_row + hbs == mi_params->mi_rows) &&
      (mi_col + bs < mi_params->mi_cols ||
       mi_col + hbs == mi_params->mi_cols)) {
    BLOCK_SIZE split_subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    chosen_rdc.rate = 0;
    chosen_rdc.dist = 0;

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    pc_tree->partitioning = PARTITION_SPLIT;

    // Split partition.
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      RD_STATS tmp_rdc;

      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      pc_tree->split[i]->partitioning = PARTITION_NONE;
      if (pc_tree->split[i]->none == NULL)
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, split_subsize, &td->shared_coeff_buf);
      if (!pc_tree->split[i]->none)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      pick_sb_modes(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx, &tmp_rdc,
                    PARTITION_SPLIT, split_subsize, pc_tree->split[i]->none,
                    invalid_rdc);

      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
        av1_invalid_rd_stats(&chosen_rdc);
        break;
      }

      chosen_rdc.rate += tmp_rdc.rate;
      chosen_rdc.dist += tmp_rdc.dist;

      if (i != SUB_PARTITIONS_SPLIT - 1)
        encode_sb(cpi, td, tile_data, tp, mi_row + y_idx, mi_col + x_idx,
                  OUTPUT_ENABLED, split_subsize, pc_tree->split[i], NULL);

      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
    }
    if (chosen_rdc.rate < INT_MAX) {
      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      chosen_rdc.rdcost = RDCOST(x->rdmult, chosen_rdc.rate, chosen_rdc.dist);
    }
  }

  // If last_part is better set the partitioning to that.
  if (last_part_rdc.rdcost < chosen_rdc.rdcost) {
    mib[0]->bsize = bs_type;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = partition;

    chosen_rdc = last_part_rdc;
  }
  // If none was better set the partitioning to that.
  if (none_rdc.rdcost < INT64_MAX &&
      none_rdc.rdcost - (none_rdc.rdcost >> 9) < chosen_rdc.rdcost) {
    mib[0]->bsize = bsize;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = PARTITION_NONE;
    chosen_rdc = none_rdc;
  }

  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  // We must have chosen a partitioning and encoding or we'll fail later on.
  // No other opportunities for success.
  if (bsize == cm->seq_params->sb_size)
    assert(chosen_rdc.rate < INT_MAX && chosen_rdc.dist < INT64_MAX);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (do_recon) {
    if (bsize == cm->seq_params->sb_size) {
      // NOTE: To get estimate for rate due to the tokens, use:
      // int rate_coeffs = 0;
      // encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_COSTCOEFFS,
      //           bsize, pc_tree, &rate_coeffs);
      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, OUTPUT_ENABLED, bsize,
                pc_tree, NULL);
    } else {
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  *rate = chosen_rdc.rate;
  *dist = chosen_rdc.dist;
  x->rdmult = orig_rdmult;
}